

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (RayDifferential *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *rayi,
          BSDF *bsdf,Vector3f wi,int flags,Float eta)

{
  Vector3f *c;
  Normal3f *this_00;
  Normal3f *this_01;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  type tVar9;
  type tVar10;
  float fVar11;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar35;
  undefined4 uVar41;
  float fVar42;
  float fVar43;
  undefined4 uVar44;
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar47;
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  Normal3<float> NVar55;
  Normal3<float> NVar56;
  Vector3<float> VVar57;
  Vector3<float> VVar58;
  Point3f PVar59;
  Point3<float> PVar60;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  Normal3<float> local_f8;
  Normal3<float> local_e8;
  Normal3<float> local_d8;
  undefined1 local_c8 [16];
  Tuple3<pbrt::Vector3,_float> local_b0;
  Vector3f local_a0;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 auVar33 [56];
  undefined1 auVar34 [56];
  
  local_a0.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._8_56_ = wi._8_56_;
  auVar17._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8._0_4_ = eta;
  uVar31 = vmovlps_avx(auVar17._0_16_);
  local_a0.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar31;
  local_a0.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar31 >> 0x20);
  Interaction::SpawnRay(__return_storage_ptr__,&this->super_Interaction,&local_a0);
  if (rayi->hasDifferentials == true) {
    local_f8.super_Tuple3<pbrt::Normal3,_float>.z =
         (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    this_00 = &(this->shading).dndu;
    uVar5 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar6 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar31 = 0;
    local_f8.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar5;
    local_f8.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar6;
    NVar55 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_00,this->dudx);
    uVar32 = 0;
    this_01 = &(this->shading).dndv;
    NVar56 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_01,this->dvdx);
    local_108 = NVar55.super_Tuple3<pbrt::Normal3,_float>.x;
    fStack_104 = NVar55.super_Tuple3<pbrt::Normal3,_float>.y;
    fStack_100 = (float)uVar31;
    fStack_fc = (float)((ulong)uVar31 >> 0x20);
    auVar13._0_4_ = NVar56.super_Tuple3<pbrt::Normal3,_float>.x + local_108;
    auVar13._4_4_ = NVar56.super_Tuple3<pbrt::Normal3,_float>.y + fStack_104;
    auVar13._8_4_ = (float)uVar32 + fStack_100;
    auVar13._12_4_ = (float)((ulong)uVar32 >> 0x20) + fStack_fc;
    local_d8.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar56.super_Tuple3<pbrt::Normal3,_float>.z + NVar55.super_Tuple3<pbrt::Normal3,_float>.z;
    local_d8.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar13);
    uVar31 = 0;
    NVar55 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_00,this->dudy);
    uVar32 = 0;
    NVar56 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)this_01,this->dvdy);
    local_108 = NVar55.super_Tuple3<pbrt::Normal3,_float>.x;
    fStack_104 = NVar55.super_Tuple3<pbrt::Normal3,_float>.y;
    fStack_100 = (float)uVar31;
    fStack_fc = (float)((ulong)uVar31 >> 0x20);
    auVar12._0_4_ = NVar56.super_Tuple3<pbrt::Normal3,_float>.x + local_108;
    auVar12._4_4_ = NVar56.super_Tuple3<pbrt::Normal3,_float>.y + fStack_104;
    auVar12._8_4_ = (float)uVar32 + fStack_100;
    auVar12._12_4_ = (float)((ulong)uVar32 >> 0x20) + fStack_fc;
    auVar33 = ZEXT856(auVar12._8_8_);
    local_e8.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar56.super_Tuple3<pbrt::Normal3,_float>.z + NVar55.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar41 = 0;
    uVar44 = 0;
    uVar31 = vmovlps_avx(auVar12);
    local_e8.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar31;
    local_e8.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar31 >> 0x20);
    VVar57 = Tuple3<pbrt::Vector3,_float>::operator-
                       (&(rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>);
    local_b0.z = VVar57.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar57.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar33;
    c = &(this->super_Interaction).wo;
    local_b0._0_8_ = vmovlps_avx(auVar18._0_16_);
    VVar57 = Tuple3<pbrt::Vector3,float>::operator-(&local_b0,c);
    fVar11 = VVar57.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._0_8_ = VVar57.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar33;
    auVar13 = auVar19._0_16_;
    auVar34 = auVar33;
    VVar58 = Tuple3<pbrt::Vector3,_float>::operator-
                       (&(rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>);
    local_b0.z = VVar58.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20._0_8_ = VVar58.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar34;
    local_b0._0_8_ = vmovlps_avx(auVar20._0_16_);
    VVar58 = Tuple3<pbrt::Vector3,float>::operator-(&local_b0,c);
    auVar21._0_8_ = VVar58.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar34;
    if (flags == 0x12) {
      uStack_70 = 0;
      __return_storage_ptr__->hasDifferentials = true;
      local_88 = auVar21._0_16_;
      local_78 = VVar58.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_74 = uVar41;
      uStack_6c = uVar44;
      PVar59 = Interaction::p(&this->super_Interaction);
      local_b0.z = PVar59.super_Tuple3<pbrt::Point3,_float>.z;
      auVar26._0_8_ = PVar59.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar26._8_56_ = auVar34;
      local_b0._0_8_ = vmovlps_avx(auVar26._0_16_);
      PVar60 = Point3<float>::operator+((Point3<float> *)&local_b0,&this->dpdx);
      auVar27._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar27._8_56_ = auVar34;
      uVar31 = vmovlps_avx(auVar27._0_16_);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar31;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar31 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      PVar59 = Interaction::p(&this->super_Interaction);
      local_b0.z = PVar59.super_Tuple3<pbrt::Point3,_float>.z;
      auVar28._0_8_ = PVar59.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar28._8_56_ = auVar34;
      local_b0._0_8_ = vmovlps_avx(auVar28._0_16_);
      PVar60 = Point3<float>::operator+((Point3<float> *)&local_b0,&this->dpdy);
      auVar29._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar29._8_56_ = auVar34;
      uVar31 = vmovlps_avx(auVar29._0_16_);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar31;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar31 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      local_c8._0_4_ = 1.0 / (float)local_c8._0_4_;
      local_c8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      tVar9 = Dot<float>(c,&local_f8);
      auVar16 = ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.x);
      if (0.0 <= tVar9) {
        auVar38._4_4_ = local_f8.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar38._0_4_ = local_f8.super_Tuple3<pbrt::Normal3,_float>.y;
        auVar38._8_8_ = 0;
      }
      else {
        auVar16._0_4_ = -local_f8.super_Tuple3<pbrt::Normal3,_float>.x;
        auVar16._4_4_ = 0x80000000;
        auVar16._8_4_ = 0x80000000;
        auVar16._12_4_ = 0x80000000;
        auVar38._0_8_ =
             CONCAT44(local_f8.super_Tuple3<pbrt::Normal3,_float>.z,
                      local_f8.super_Tuple3<pbrt::Normal3,_float>.y) ^ 0x8000000080000000;
        auVar38._8_4_ = 0x80000000;
        auVar38._12_4_ = 0x80000000;
        local_d8.super_Tuple3<pbrt::Normal3,_float>.z =
             -local_d8.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar12 = vunpcklps_avx(auVar16,auVar38);
        uVar31 = vmovlps_avx(auVar12);
        local_f8.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar31;
        local_f8.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar31 >> 0x20);
        local_f8.super_Tuple3<pbrt::Normal3,_float>.z = (float)vextractps_avx(auVar38,1);
        auVar48._0_8_ = local_d8.super_Tuple3<pbrt::Normal3,_float>._0_8_ ^ 0x8000000080000000;
        auVar48._8_4_ = 0x80000000;
        auVar48._12_4_ = 0x80000000;
        local_d8.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar48);
        auVar49._0_8_ =
             CONCAT44(local_e8.super_Tuple3<pbrt::Normal3,_float>.y,
                      local_e8.super_Tuple3<pbrt::Normal3,_float>.x) ^ 0x8000000080000000;
        auVar49._8_4_ = 0x80000000;
        auVar49._12_4_ = 0x80000000;
        local_e8.super_Tuple3<pbrt::Normal3,_float>.z =
             -local_e8.super_Tuple3<pbrt::Normal3,_float>.z;
        uVar31 = vmovlps_avx(auVar49);
        local_e8.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar31;
        local_e8.super_Tuple3<pbrt::Normal3,_float>.y = (float)((ulong)uVar31 >> 0x20);
      }
      auVar12 = vmovshdup_avx(auVar38);
      auVar48 = vmovshdup_avx(auVar13);
      auVar49 = ZEXT416((uint)(fVar11 * auVar12._0_4_));
      auVar38 = vfmadd213ss_fma(auVar48,auVar38,auVar49);
      auVar12 = vfmsub213ss_fma(auVar12,ZEXT416((uint)fVar11),auVar49);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ + auVar12._0_4_)),auVar13,auVar16);
      tVar9 = Dot<float>(c,&local_d8);
      auVar8._4_4_ = uStack_74;
      auVar8._0_4_ = local_78;
      auVar8._8_4_ = uStack_70;
      auVar8._12_4_ = uStack_6c;
      local_68._0_4_ = tVar9 + auVar13._0_4_;
      local_58 = vmovshdup_avx(local_88);
      auVar13 = vfmadd132ss_fma(ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.y),
                                ZEXT416((uint)(local_78 *
                                              local_f8.super_Tuple3<pbrt::Normal3,_float>.z)),
                                local_58);
      auVar12 = vfmsub213ss_fma(auVar8,ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.z),
                                ZEXT416((uint)(local_78 *
                                              local_f8.super_Tuple3<pbrt::Normal3,_float>.z)));
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_)),local_88,
                                ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.x));
      tVar9 = Dot<float>(c,&local_e8);
      local_8c = tVar9 + auVar13._0_4_;
      tVar9 = Dot<float>(c,&local_f8);
      auVar30._0_4_ = AbsDot<float>(&local_a0,&local_f8);
      auVar30._4_60_ = extraout_var;
      local_48 = vfmsub231ss_fma(auVar30._0_16_,local_c8,ZEXT416((uint)tVar9));
      fVar35 = local_c8._0_4_ * local_c8._0_4_;
      tVar9 = Dot<float>(c,&local_f8);
      local_90 = tVar9 * fVar35;
      tVar9 = AbsDot<float>(&local_a0,&local_f8);
      local_68 = ZEXT416((uint)(((float)local_c8._0_4_ - local_90 / tVar9) * (float)local_68._0_4_))
      ;
      tVar9 = Dot<float>(c,&local_f8);
      tVar10 = AbsDot<float>(&local_a0,&local_f8);
      auVar52._4_4_ = local_f8.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar52._0_4_ = local_f8.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar52._8_8_ = 0;
      auVar54._4_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar54._0_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar54._8_8_ = 0;
      auVar13 = vmovshdup_avx(auVar52);
      fVar47 = ((float)local_c8._0_4_ - (tVar9 * fVar35) / tVar10) * local_8c;
      auVar12 = vmovshdup_avx(auVar54);
      fVar35 = (local_a0.super_Tuple3<pbrt::Vector3,_float>.x -
               (float)local_c8._0_4_ * (float)local_88._0_4_) +
               fVar47 * local_f8.super_Tuple3<pbrt::Normal3,_float>.x +
               (float)local_48._0_4_ * local_e8.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar50._4_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar50._0_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar50._8_8_ = 0;
      local_108 = VVar57.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_104 = VVar57.super_Tuple3<pbrt::Vector3,_float>.y;
      fStack_100 = auVar33._0_4_;
      fStack_fc = auVar33._4_4_;
      auVar53._0_4_ = (float)local_c8._0_4_ * local_108;
      auVar53._4_4_ = (float)local_c8._0_4_ * fStack_104;
      auVar53._8_4_ = (float)local_c8._0_4_ * fStack_100;
      auVar53._12_4_ = (float)local_c8._0_4_ * fStack_fc;
      auVar16 = vsubps_avx(auVar50,auVar53);
      auVar51._0_4_ =
           auVar16._0_4_ +
           (float)local_48._0_4_ * local_d8.super_Tuple3<pbrt::Normal3,_float>.x +
           (float)local_68._0_4_ * local_f8.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar51._4_4_ =
           auVar16._4_4_ +
           (float)local_48._0_4_ * local_d8.super_Tuple3<pbrt::Normal3,_float>.y +
           (float)local_68._0_4_ * local_f8.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar51._8_4_ = auVar16._8_4_ + (float)local_48._0_4_ * 0.0 + (float)local_68._0_4_ * 0.0;
      auVar51._12_4_ = auVar16._12_4_ + (float)local_48._0_4_ * 0.0 + (float)local_68._0_4_ * 0.0;
      uVar31 = vmovlps_avx(auVar51);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar31;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar31 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           (auVar12._0_4_ - (float)local_c8._0_4_ * fVar11) +
           (float)local_68._0_4_ * auVar13._0_4_ +
           (float)local_48._0_4_ * local_d8.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar13 = vinsertps_avx(local_58,ZEXT416((uint)local_78),0x10);
      auVar46._0_4_ = (float)local_c8._0_4_ * auVar13._0_4_;
      auVar46._4_4_ = (float)local_c8._0_4_ * auVar13._4_4_;
      auVar46._8_4_ = (float)local_c8._0_4_ * auVar13._8_4_;
      auVar46._12_4_ = (float)local_c8._0_4_ * auVar13._12_4_;
      auVar13 = vsubps_avx(auVar54,auVar46);
      auVar37._0_4_ =
           auVar13._0_4_ +
           fVar47 * local_f8.super_Tuple3<pbrt::Normal3,_float>.y +
           (float)local_48._0_4_ * local_e8.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar37._4_4_ =
           auVar13._4_4_ +
           fVar47 * local_f8.super_Tuple3<pbrt::Normal3,_float>.z +
           (float)local_48._0_4_ * local_e8.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar37._8_4_ = auVar13._8_4_ + fVar47 * 0.0 + (float)local_48._0_4_ * 0.0;
      auVar37._12_4_ = auVar13._12_4_ + fVar47 * 0.0 + (float)local_48._0_4_ * 0.0;
    }
    else {
      if (flags != 0x11) goto LAB_004c4bb4;
      __return_storage_ptr__->hasDifferentials = true;
      uStack_70 = 0;
      local_88 = auVar21._0_16_;
      local_78 = VVar58.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_74 = uVar41;
      uStack_6c = uVar44;
      PVar59 = Interaction::p(&this->super_Interaction);
      local_b0.z = PVar59.super_Tuple3<pbrt::Point3,_float>.z;
      auVar22._0_8_ = PVar59.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar22._8_56_ = auVar34;
      local_b0._0_8_ = vmovlps_avx(auVar22._0_16_);
      PVar60 = Point3<float>::operator+((Point3<float> *)&local_b0,&this->dpdx);
      auVar23._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar23._8_56_ = auVar34;
      uVar31 = vmovlps_avx(auVar23._0_16_);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar31;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar31 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      PVar59 = Interaction::p(&this->super_Interaction);
      local_b0.z = PVar59.super_Tuple3<pbrt::Point3,_float>.z;
      auVar24._0_8_ = PVar59.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar24._8_56_ = auVar34;
      local_b0._0_8_ = vmovlps_avx(auVar24._0_16_);
      PVar60 = Point3<float>::operator+((Point3<float> *)&local_b0,&this->dpdy);
      auVar25._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar25._8_56_ = auVar34;
      uVar31 = vmovlps_avx(auVar25._0_16_);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar31;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar31 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      auVar12 = vmovshdup_avx(auVar13);
      auVar12 = vfmadd132ss_fma(auVar12,ZEXT416((uint)(fVar11 * local_f8.
                                                  super_Tuple3<pbrt::Normal3,_float>.z)),
                                ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.y));
      auVar16 = vfmsub213ss_fma(ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.z),
                                ZEXT416((uint)fVar11),
                                ZEXT416((uint)(fVar11 * local_f8.super_Tuple3<pbrt::Normal3,_float>.
                                                        z)));
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ + auVar16._0_4_)),auVar13,
                                ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.x));
      local_c8._0_4_ = auVar12._0_4_;
      tVar9 = Dot<float>(c,&local_d8);
      fVar35 = tVar9 + (float)local_c8._0_4_;
      auVar7._4_4_ = uStack_74;
      auVar7._0_4_ = local_78;
      auVar7._8_4_ = uStack_70;
      auVar7._12_4_ = uStack_6c;
      local_c8 = vmovshdup_avx(local_88);
      local_58 = ZEXT416((uint)fVar35);
      auVar12 = vfmadd132ss_fma(ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.y),
                                ZEXT416((uint)(local_78 *
                                              local_f8.super_Tuple3<pbrt::Normal3,_float>.z)),
                                local_c8);
      auVar16 = vfmsub213ss_fma(auVar7,ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.z),
                                ZEXT416((uint)(local_78 *
                                              local_f8.super_Tuple3<pbrt::Normal3,_float>.z)));
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ + auVar16._0_4_)),local_88,
                                ZEXT416((uint)local_f8.super_Tuple3<pbrt::Normal3,_float>.x));
      tVar9 = Dot<float>(c,&local_e8);
      fVar47 = tVar9 + auVar12._0_4_;
      fVar11 = local_a0.super_Tuple3<pbrt::Vector3,_float>.z - fVar11;
      auVar14._4_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar14._0_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar14._8_8_ = 0;
      auVar13 = vsubps_avx(auVar14,auVar13);
      tVar9 = Dot<float>(c,&local_f8);
      fVar35 = tVar9 * local_d8.super_Tuple3<pbrt::Normal3,_float>.x +
               (float)local_58._0_4_ * local_f8.super_Tuple3<pbrt::Normal3,_float>.x;
      fVar42 = tVar9 * local_d8.super_Tuple3<pbrt::Normal3,_float>.y +
               (float)local_58._0_4_ * local_f8.super_Tuple3<pbrt::Normal3,_float>.y;
      fVar43 = tVar9 * 0.0 + (float)local_58._0_4_ * 0.0;
      fVar45 = tVar9 * 0.0 + (float)local_58._0_4_ * 0.0;
      local_108 = auVar13._0_4_;
      fStack_104 = auVar13._4_4_;
      fStack_100 = auVar13._8_4_;
      fStack_fc = auVar13._12_4_;
      auVar36._0_4_ = fVar35 + fVar35 + local_108;
      auVar36._4_4_ = fVar42 + fVar42 + fStack_104;
      auVar36._8_4_ = fVar43 + fVar43 + fStack_100;
      auVar36._12_4_ = fVar45 + fVar45 + fStack_fc;
      fVar35 = tVar9 * local_d8.super_Tuple3<pbrt::Normal3,_float>.z +
               (float)local_58._0_4_ * local_f8.super_Tuple3<pbrt::Normal3,_float>.z;
      uVar31 = vmovlps_avx(auVar36);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar31;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar31 >> 0x20);
      auVar13 = vinsertps_avx(local_c8,ZEXT416((uint)local_78),0x10);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           fVar35 + fVar35 + fVar11;
      fVar35 = local_a0.super_Tuple3<pbrt::Vector3,_float>.x - (float)local_88._0_4_;
      auVar15._4_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_4_ = local_a0.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar15._8_8_ = 0;
      auVar13 = vsubps_avx(auVar15,auVar13);
      tVar9 = Dot<float>(c,&local_f8);
      fVar11 = tVar9 * local_e8.super_Tuple3<pbrt::Normal3,_float>.x +
               fVar47 * local_f8.super_Tuple3<pbrt::Normal3,_float>.x;
      fVar42 = tVar9 * local_e8.super_Tuple3<pbrt::Normal3,_float>.y +
               fVar47 * local_f8.super_Tuple3<pbrt::Normal3,_float>.y;
      fVar43 = tVar9 * local_e8.super_Tuple3<pbrt::Normal3,_float>.z +
               fVar47 * local_f8.super_Tuple3<pbrt::Normal3,_float>.z;
      fVar45 = tVar9 * 0.0 + fVar47 * 0.0;
      fVar47 = tVar9 * 0.0 + fVar47 * 0.0;
      fVar35 = fVar11 + fVar11 + fVar35;
      local_118 = auVar13._0_4_;
      fStack_114 = auVar13._4_4_;
      fStack_110 = auVar13._8_4_;
      fStack_10c = auVar13._12_4_;
      auVar37._0_4_ = fVar42 + fVar42 + local_118;
      auVar37._4_4_ = fVar43 + fVar43 + fStack_114;
      auVar37._8_4_ = fVar45 + fVar45 + fStack_110;
      auVar37._12_4_ = fVar47 + fVar47 + fStack_10c;
    }
    auVar13 = vunpcklps_avx(ZEXT416((uint)fVar35),auVar37);
    uVar31 = vmovlps_avx(auVar13);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar31;
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar31 >> 0x20);
    fVar11 = (float)vextractps_avx(auVar37,1);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
  }
LAB_004c4bb4:
  fVar11 = LengthSquared<float>(&__return_storage_ptr__->rxDirection);
  if ((((fVar11 <= 1e+16) &&
       (fVar11 = LengthSquared<float>(&__return_storage_ptr__->ryDirection), fVar11 <= 1e+16)) &&
      (fVar11 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x,
      uVar1 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y,
      uVar3 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z,
      auVar39._0_4_ = (float)uVar1 * (float)uVar1, auVar39._4_4_ = (float)uVar3 * (float)uVar3,
      auVar39._8_8_ = 0, auVar13 = vmovshdup_avx(auVar39),
      fVar11 * fVar11 + auVar39._0_4_ + auVar13._0_4_ <= 1e+16)) &&
     (fVar11 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x,
     uVar2 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y,
     uVar4 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z,
     auVar40._0_4_ = (float)uVar2 * (float)uVar2, auVar40._4_4_ = (float)uVar4 * (float)uVar4,
     auVar40._8_8_ = 0, auVar13 = vmovshdup_avx(auVar40),
     fVar11 * fVar11 + auVar40._0_4_ + auVar13._0_4_ <= 1e+16)) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->hasDifferentials = false;
  return __return_storage_ptr__;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, Vector3f wi, int flags,
                                             Float eta) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == BxDFFlags::SpecularReflection) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dwoDotNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dwoDotNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2 * Vector3f(Dot(wo, ns) * dndx + dwoDotNdx * ns);
            rd.ryDirection =
                wi - dwody + 2 * Vector3f(Dot(wo, ns) * dndy + dwoDotNdy * ns);

        } else if (flags == BxDFFlags::SpecularTransmission) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // Find _eta_ and oriented surface normal for transmission
            eta = 1 / eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }

            // Compute partial derivatives of $\mu$
            Float dwoDotNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dwoDotNdy = Dot(dwody, ns) + Dot(wo, dndy);
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dwoDotNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dwoDotNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}